

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v7::detail::buffer<wchar_t>::append<wchar_t>(buffer<wchar_t> *this,wchar_t *begin,wchar_t *end)

{
  long lVar1;
  ulong uVar2;
  
  lVar1 = (long)end - (long)begin >> 2;
  if (-1 < lVar1) {
    uVar2 = lVar1 + this->size_;
    if (this->capacity_ < uVar2) {
      (**this->_vptr_buffer)(this,uVar2);
    }
    if (end != begin) {
      memmove(this->ptr_ + this->size_,begin,(long)end - (long)begin);
    }
    this->size_ = uVar2;
    return;
  }
  assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/robertoraggi[P]pgen/build_O3/_deps/fmt-src/include/fmt/core.h"
              ,0x13d,"negative value");
}

Assistant:

void buffer<T>::append(const U* begin, const U* end) {
  size_t new_size = size_ + to_unsigned(end - begin);
  reserve(new_size);
  std::uninitialized_copy(begin, end,
                          make_checked(ptr_ + size_, capacity_ - size_));
  size_ = new_size;
}